

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

DescriptorKeyReference * __thiscall
cfd::core::DescriptorNode::GetKeyReferences
          (DescriptorKeyReference *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  DescriptorKeyType DVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer puVar4;
  pointer pcVar5;
  byte bVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint32_t child_num;
  long lVar11;
  CfdException *pCVar12;
  _Alloc_hider _Var13;
  string *arg;
  string using_key;
  string arg_value;
  SchnorrPubkey schnorr_pubkey;
  KeyData key_data;
  Pubkey local_588;
  string local_568;
  undefined1 local_548 [32];
  pointer puStack_528;
  pointer local_520;
  pointer puStack_518;
  pointer local_510;
  pointer local_508;
  pointer puStack_500;
  pointer local_4f8;
  pointer local_4f0;
  pointer puStack_4e8;
  pointer local_4e0;
  DescriptorKeyType *local_4d0;
  string local_4c8;
  ByteData256 local_4a8;
  undefined1 local_488 [32];
  pointer puStack_468;
  pointer local_460;
  pointer puStack_458;
  pointer local_450;
  pointer local_448;
  pointer puStack_440;
  pointer local_438;
  pointer local_430;
  pointer puStack_428;
  pointer local_420;
  pointer local_418;
  undefined1 local_1f8 [32];
  pointer puStack_1d8;
  pointer local_1d0;
  pointer puStack_1c8;
  pointer local_1c0;
  pointer local_1b8;
  pointer puStack_1b0;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_198;
  pointer puStack_190;
  pointer local_188;
  KeyData local_180;
  
  DescriptorKeyReference::DescriptorKeyReference(__return_storage_ptr__);
  Pubkey::Pubkey(&local_588);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  pcVar2 = (this->key_info_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,pcVar2,pcVar2 + (this->key_info_)._M_string_length);
  KeyData::KeyData(&local_180);
  local_4d0 = &this->key_type_;
  DVar1 = this->key_type_;
  if (DVar1 - kDescriptorKeyBip32 < 2) {
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    local_4c8._M_string_length = 0;
    local_4c8.field_2._M_local_buf[0] = '\0';
    if (this->need_arg_num_ == 0) {
      arg = (string *)0x0;
      bVar9 = true;
LAB_00192ae2:
      bVar6 = 1;
    }
    else {
      if ((array_argument ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) ||
         (pbVar3 = (array_argument->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         pbVar3 == (array_argument->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)) {
        local_488._0_8_ = "cfdcore_descriptor.cpp";
        local_488._8_4_ = 0x765;
        local_488._16_8_ = "GetKeyReferences";
        logger::log<>((CfdSourceLocation *)local_488,kCfdLogLevelWarning,
                      "Failed to generate pubkey from hdkey.");
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        local_488._0_8_ = local_488 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"Failed to generate pubkey from hdkey.","");
        CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_488);
        __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_488 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"base","");
      uVar7 = local_488._0_8_;
      puVar4 = (pointer)pbVar3->_M_string_length;
      if (puVar4 == (pointer)local_488._8_8_) {
        if (puVar4 == (pointer)0x0) {
          bVar9 = true;
        }
        else {
          iVar10 = bcmp((pbVar3->_M_dataplus)._M_p,(void *)local_488._0_8_,(size_t)puVar4);
          bVar9 = iVar10 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_488 + 0x10)) {
        operator_delete((void *)uVar7);
      }
      if (!bVar9) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_4c8,0,(char *)local_4c8._M_string_length,0x218a6c);
        arg = &local_4c8;
        ::std::__cxx11::string::_M_assign((string *)arg);
        pbVar3 = (array_argument->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (array_argument->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar5 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar3[-1].field_2) {
          operator_delete(pcVar5);
        }
        bVar9 = false;
        goto LAB_00192ae2;
      }
      ::std::__cxx11::string::_M_assign((string *)&local_568);
      arg = (string *)0x0;
      bVar9 = true;
      bVar6 = 0;
    }
    ExtPubkey::ExtPubkey((ExtPubkey *)local_548);
    ByteData256::ByteData256(&local_4a8);
    if ((this->tweak_sum_)._M_string_length != 0) {
      ByteData256::ByteData256((ByteData256 *)local_488,&this->tweak_sum_);
      puVar4 = local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
      local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
      local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_488._16_8_;
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_488._8_8_ = (pointer)0x0;
      local_488._16_8_ = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar4 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(puVar4),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_488._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete((void *)local_488._0_8_);
      }
    }
    if (*local_4d0 == kDescriptorKeyBip32Priv) {
      ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1f8,&local_568,&local_4a8);
      if (!bVar9) {
        ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_488,(ExtPrivkey *)local_1f8,&local_4c8);
        uVar7 = local_1f8._0_8_;
        local_1f8._0_8_ = local_488._0_8_;
        local_1f8._8_8_ = local_488._8_8_;
        local_1f8._16_8_ = local_488._16_8_;
        local_488._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_488._8_8_ = (pointer)0x0;
        local_488._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar7);
        }
        puVar4 = local_1d0;
        local_1f8._24_8_ = local_488._24_8_;
        puStack_1d8 = puStack_468;
        local_1d0 = local_460;
        puStack_1c8 = puStack_458;
        local_1c0 = local_450;
        local_460 = (pointer)0x0;
        puStack_458 = (pointer)0x0;
        local_450 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_1b8;
        local_1b8 = local_448;
        puStack_1b0 = puStack_440;
        local_1a8 = local_438;
        local_448 = (pointer)0x0;
        puStack_440 = (pointer)0x0;
        local_438 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_198;
        local_1a0 = local_430;
        local_198 = puStack_428;
        puStack_190 = local_420;
        local_188 = local_418;
        puStack_428 = (pointer)0x0;
        local_420 = (pointer)0x0;
        local_418 = (pointer)0x0;
        if ((puVar4 != (pointer)0x0) && (operator_delete(puVar4), puStack_428 != (pointer)0x0)) {
          operator_delete(puStack_428);
        }
        if (local_448 != (pointer)0x0) {
          operator_delete(local_448);
        }
        if (local_460 != (pointer)0x0) {
          operator_delete(local_460);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_488._0_8_);
        }
      }
      ExtPrivkey::GetExtPubkey((ExtPubkey *)local_488,(ExtPrivkey *)local_1f8);
      uVar7 = local_548._0_8_;
      local_548._0_8_ = local_488._0_8_;
      local_548._8_8_ = local_488._8_8_;
      local_548._16_8_ = local_488._16_8_;
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_488._8_8_ = (pointer)0x0;
      local_488._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)uVar7);
      }
      puVar4 = local_520;
      local_548._24_8_ = local_488._24_8_;
      puStack_528 = puStack_468;
      local_520 = local_460;
      puStack_518 = puStack_458;
      local_510 = local_450;
      local_460 = (pointer)0x0;
      puStack_458 = (pointer)0x0;
      local_450 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_508;
      local_508 = local_448;
      puStack_500 = puStack_440;
      local_4f8 = local_438;
      local_448 = (pointer)0x0;
      puStack_440 = (pointer)0x0;
      local_438 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_4f0;
      local_4f0 = local_430;
      puStack_4e8 = puStack_428;
      local_4e0 = local_420;
      local_430 = (pointer)0x0;
      puStack_428 = (pointer)0x0;
      local_420 = (pointer)0x0;
      if ((puVar4 != (pointer)0x0) && (operator_delete(puVar4), local_430 != (pointer)0x0)) {
        operator_delete(local_430);
      }
      if (local_448 != (pointer)0x0) {
        operator_delete(local_448);
      }
      if (local_460 != (pointer)0x0) {
        operator_delete(local_460);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_488._0_8_);
      }
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_488,(ExtPrivkey *)local_1f8,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_488);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
      if (local_198 != (pointer)0x0) {
        operator_delete(local_198);
      }
      if (local_1b8 != (pointer)0x0) {
        operator_delete(local_1b8);
      }
      if (local_1d0 != (pointer)0x0) {
        operator_delete(local_1d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
    }
    else {
      ExtPubkey::ExtPubkey((ExtPubkey *)local_488,&local_568,&local_4a8);
      uVar7 = local_548._0_8_;
      local_548._0_8_ = local_488._0_8_;
      local_548._8_8_ = local_488._8_8_;
      local_548._16_8_ = local_488._16_8_;
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_488._8_8_ = (pointer)0x0;
      local_488._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)uVar7);
      }
      puVar4 = local_520;
      local_548._24_8_ = local_488._24_8_;
      puStack_528 = puStack_468;
      local_520 = local_460;
      puStack_518 = puStack_458;
      local_510 = local_450;
      local_460 = (pointer)0x0;
      puStack_458 = (pointer)0x0;
      local_450 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_508;
      local_508 = local_448;
      puStack_500 = puStack_440;
      local_4f8 = local_438;
      local_448 = (pointer)0x0;
      puStack_440 = (pointer)0x0;
      local_438 = (pointer)0x0;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4);
      }
      puVar4 = local_4f0;
      local_4f0 = local_430;
      puStack_4e8 = puStack_428;
      local_4e0 = local_420;
      local_430 = (pointer)0x0;
      puStack_428 = (pointer)0x0;
      local_420 = (pointer)0x0;
      if ((puVar4 != (pointer)0x0) && (operator_delete(puVar4), local_430 != (pointer)0x0)) {
        operator_delete(local_430);
      }
      if (local_448 != (pointer)0x0) {
        operator_delete(local_448);
      }
      if (local_460 != (pointer)0x0) {
        operator_delete(local_460);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_488._0_8_);
      }
      if (!bVar9) {
        ExtPubkey::DerivePubkey((ExtPubkey *)local_488,(ExtPubkey *)local_548,&local_4c8);
        uVar7 = local_548._0_8_;
        local_548._0_8_ = local_488._0_8_;
        local_548._8_8_ = local_488._8_8_;
        local_548._16_8_ = local_488._16_8_;
        local_488._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_488._8_8_ = (pointer)0x0;
        local_488._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar7);
        }
        puVar4 = local_520;
        local_548._24_8_ = local_488._24_8_;
        puStack_528 = puStack_468;
        local_520 = local_460;
        puStack_518 = puStack_458;
        local_510 = local_450;
        local_460 = (pointer)0x0;
        puStack_458 = (pointer)0x0;
        local_450 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_508;
        local_508 = local_448;
        puStack_500 = puStack_440;
        local_4f8 = local_438;
        local_448 = (pointer)0x0;
        puStack_440 = (pointer)0x0;
        local_438 = (pointer)0x0;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4);
        }
        puVar4 = local_4f0;
        local_4f0 = local_430;
        puStack_4e8 = puStack_428;
        local_4e0 = local_420;
        local_430 = (pointer)0x0;
        puStack_428 = (pointer)0x0;
        local_420 = (pointer)0x0;
        if ((puVar4 != (pointer)0x0) && (operator_delete(puVar4), local_430 != (pointer)0x0)) {
          operator_delete(local_430);
        }
        if (local_448 != (pointer)0x0) {
          operator_delete(local_448);
        }
        if (local_460 != (pointer)0x0) {
          operator_delete(local_460);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_488._0_8_);
        }
      }
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_488,(ExtPubkey *)local_548,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_488);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
    }
    bVar8 = ExtPubkey::IsValid((ExtPubkey *)local_548);
    if (!bVar8) {
      local_488._0_8_ = "cfdcore_descriptor.cpp";
      local_488._8_4_ = 0x78e;
      local_488._16_8_ = "GetKeyReferences";
      logger::log<>((CfdSourceLocation *)local_488,kCfdLogLevelWarning,
                    "Failed to generate pubkey from hdkey.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_488._0_8_ = local_488 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Failed to generate pubkey from hdkey.","");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_488);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::GetPubkey((Pubkey *)local_488,(ExtPubkey *)local_548);
    puVar4 = local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_488._16_8_;
    local_488._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_488._8_8_ = (pointer)0x0;
    local_488._16_8_ = (pointer)0x0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar4 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (operator_delete(puVar4),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_488._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete((void *)local_488._0_8_);
    }
    if (((bool)(bVar9 & bVar6)) ||
       (((char *)local_4c8._M_string_length != (char *)0x0 &&
        (lVar11 = ::std::__cxx11::string::find((char)&local_4c8,0x2f), lVar11 == -1)))) {
      child_num = ExtPubkey::GetChildNum((ExtPubkey *)local_548);
      KeyData::KeyData((KeyData *)local_488,&this->value_,child_num,false);
      KeyData::operator=(&local_180,(KeyData *)local_488);
      KeyData::~KeyData((KeyData *)local_488);
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)local_488,&local_180,arg);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_488);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_4a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4f0 != (pointer)0x0) {
      operator_delete(local_4f0);
    }
    if (local_508 != (pointer)0x0) {
      operator_delete(local_508);
    }
    if (local_520 != (pointer)0x0) {
      operator_delete(local_520);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_548._0_8_);
    }
    _Var13._M_p = local_4c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p == &local_4c8.field_2) goto LAB_00193424;
  }
  else {
    if (DVar1 != kDescriptorKeySchnorr) {
      if (DVar1 == kDescriptorKeyPublic) {
        Pubkey::Pubkey((Pubkey *)local_488,&this->key_info_);
        puVar4 = local_588.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
        local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
        local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_488._16_8_;
        local_488._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_488._8_8_ = (pointer)0x0;
        local_488._16_8_ = (pointer)0x0;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)puVar4 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (operator_delete(puVar4),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_488._0_8_ !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete((void *)local_488._0_8_);
        }
        DescriptorKeyReference::DescriptorKeyReference
                  ((DescriptorKeyReference *)local_488,&local_588);
        DescriptorKeyReference::operator=
                  (__return_storage_ptr__,(DescriptorKeyReference *)local_488);
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
        KeyData::KeyData((KeyData *)local_488,&this->value_,-1,false);
        KeyData::operator=(&local_180,(KeyData *)local_488);
        KeyData::~KeyData((KeyData *)local_488);
        DescriptorKeyReference::DescriptorKeyReference
                  ((DescriptorKeyReference *)local_488,&local_180,(string *)0x0);
        DescriptorKeyReference::operator=
                  (__return_storage_ptr__,(DescriptorKeyReference *)local_488);
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
      }
      goto LAB_00193424;
    }
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_1f8,&this->key_info_);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)local_488,(SchnorrPubkey *)local_1f8);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_488);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
    KeyData::KeyData((KeyData *)local_488,&this->value_,-1,true);
    KeyData::operator=(&local_180,(KeyData *)local_488);
    KeyData::~KeyData((KeyData *)local_488);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)local_488,&local_180,(string *)0x0);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)local_488);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_488);
    SchnorrPubkey::CreatePubkey((Pubkey *)local_488,(SchnorrPubkey *)local_1f8,false);
    puVar4 = local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_488._0_8_;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_488._8_8_;
    local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_488._16_8_;
    local_488._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_488._8_8_ = (pointer)0x0;
    local_488._16_8_ = (pointer)0x0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar4 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (operator_delete(puVar4),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_488._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete((void *)local_488._0_8_);
    }
    _Var13._M_p = (pointer)local_1f8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00193424;
  }
  operator_delete(_Var13._M_p);
LAB_00193424:
  bVar9 = Pubkey::IsValid(&local_588);
  if (!bVar9) {
    local_488._0_8_ = "cfdcore_descriptor.cpp";
    local_488._8_4_ = 0x7a3;
    local_488._16_8_ = "GetKeyReferences";
    logger::
    log<cfd::core::DescriptorNodeType_const&,cfd::core::DescriptorKeyType_const&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_488,kCfdLogLevelWarning,
               "Failed to pubkey. type={}-{}, key_info={}",&this->node_type_,local_4d0,&local_568);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_488._0_8_ = local_488 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Invalid pubkey data.","")
    ;
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_488);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  KeyData::~KeyData(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DescriptorKeyReference DescriptorNode::GetKeyReferences(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference result;
  Pubkey pubkey;
  std::string using_key = key_info_;
  KeyData key_data;
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    pubkey = Pubkey(key_info_);
    result = DescriptorKeyReference(pubkey);
    try {
      key_data = KeyData(value_);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey(key_info_);
    result = DescriptorKeyReference(schnorr_pubkey);
    try {
      key_data = KeyData(value_, -1, true);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
    pubkey = schnorr_pubkey.CreatePubkey();
  } else if (
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) ||
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv)) {
    std::string arg_value;
    std::string* arg_pointer = nullptr;
    uint32_t need_arg_num = need_arg_num_;
    bool has_base = false;
    if (need_arg_num == 0) {
      // Fixed key. For strengthened keys, xprv/tprv is required.
    } else if ((array_argument == nullptr) || array_argument->empty()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    } else if (
        (array_argument != nullptr) && (!array_argument->empty()) &&
        (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
      using_key = base_extkey_;
      need_arg_num = 0;
      has_base = true;
    } else {
      // Dynamic key generation. For strengthened keys, xprv/tprv is required.
      // If array_argument is nullptr, set it to 0 temporarily.
      // (For generate test)
      arg_value = "0";
      if (array_argument != nullptr) {
        arg_value = array_argument->back();
        array_argument->pop_back();
      }
      arg_pointer = &arg_value;
    }

    ExtPubkey xpub;
    ByteData256 tweak_sum;
    if (!tweak_sum_.empty()) tweak_sum = ByteData256(tweak_sum_);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpriv = xpriv.DerivePrivkey(arg_value);
      }
      xpub = xpriv.GetExtPubkey();
      result = DescriptorKeyReference(xpriv, arg_pointer);
    } else {
      xpub = ExtPubkey(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpub = xpub.DerivePubkey(arg_value);
      }
      result = DescriptorKeyReference(xpub, arg_pointer);
    }

    if (!xpub.IsValid()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    }
    pubkey = xpub.GetPubkey();

    try {
      if (((need_arg_num == 0) && (!has_base)) ||
          ((!arg_value.empty()) &&
           (arg_value.find('/') == std::string::npos))) {
        key_data = KeyData(value_, static_cast<int32_t>(xpub.GetChildNum()));
        result = DescriptorKeyReference(key_data, arg_pointer);
      }
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  }

  if (!pubkey.IsValid()) {
    warn(
        CFD_LOG_SOURCE, "Failed to pubkey. type={}-{}, key_info={}",
        node_type_, key_type_, using_key);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid pubkey data.");
  }
  return result;
}